

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_gsnlist(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  BUFFER *buffer;
  char *txt;
  skill_type *psVar2;
  ulong uVar3;
  int iVar4;
  char buf [4608];
  char local_1238 [4616];
  
  psVar2 = skill_table;
  buffer = new_buf();
  uVar3 = 0;
  iVar4 = 0;
  do {
    if (psVar2->name != (char *)0x0) {
      sprintf(local_1238,"%-18s %3d  ",psVar2->name,uVar3 & 0xffffffff);
      add_buf(buffer,local_1238);
      iVar1 = iVar4 * -0x55555555;
      iVar4 = iVar4 + 1;
      if (iVar1 + 0xd5555555U < 0x55555555) {
        add_buf(buffer,"\n\r");
      }
    }
    uVar3 = uVar3 + 1;
    psVar2 = psVar2 + 1;
  } while (uVar3 != 800);
  txt = buf_string(buffer);
  page_to_char(txt,ch);
  free_buf(buffer);
  return;
}

Assistant:

void do_gsnlist(CHAR_DATA *ch, char *argument)
{
	int sn, col = 0;
	char buf[MSL];
	BUFFER *output;

	output = new_buf();

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			continue;

		sprintf(buf, "%-18s %3d  ", skill_table[sn].name, sn);
		add_buf(output, buf);

		if (++col % 3 == 0)
			add_buf(output, "\n\r");
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}